

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O2

void __thiscall AddressFilter::AddToList(AddressFilter *this,uint8_t *addr,size_t len)

{
  ulong in_RAX;
  IPAsKey *this_00;
  ulong uStack_28;
  bool stored;
  
  uStack_28 = in_RAX;
  this_00 = (IPAsKey *)operator_new(0x30);
  IPAsKey::IPAsKey(this_00,addr,len);
  uStack_28 = uStack_28 & 0xffffffffffffff;
  BinHash<IPAsKey>::InsertOrAdd(&this->table,this_00,false,&stored);
  if (stored == false) {
    (*this_00->_vptr_IPAsKey[1])(this_00);
  }
  return;
}

Assistant:

void AddressFilter::AddToList(uint8_t * addr, size_t len)
{
    IPAsKey * x = new IPAsKey(addr, len);

    if (x != NULL)
    {
        bool stored = false;

        (void)table.InsertOrAdd(x, false, &stored);

        if (!stored)
        {
            delete x;
        }
    }
}